

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

Vec_Int_t * Cbs2_ManSolveMiterNc(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  size_t sVar4;
  int iVar5;
  Cbs2_Man_t *p;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  undefined8 *puVar10;
  void *__ptr;
  long lVar11;
  long lVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  int iVar15;
  Gia_Man_t *pGVar16;
  timespec ts;
  timespec local_80;
  Gia_Man_t *local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  int local_54;
  long local_50;
  undefined8 *local_48;
  Vec_Str_t **local_40;
  size_t local_38;
  
  local_70 = pAig;
  iVar5 = clock_gettime(3,&local_80);
  pGVar16 = local_70;
  if (iVar5 < 0) {
    local_50 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    local_50 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  if (local_70->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x621,"Vec_Int_t *Cbs2_ManSolveMiterNc(Gia_Man_t *, int, Vec_Str_t **, int)");
  }
  Gia_ManCreateRefs(local_70);
  p = Cbs2_ManAlloc(pGVar16);
  (p->Pars).nBTLimit = nConfs;
  pVVar14 = pGVar16->vCos;
  iVar15 = pVVar14->nSize - pGVar16->nRegs;
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar5 = iVar15;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)malloc((long)iVar5);
  }
  pVVar6->pArray = pcVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 10000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(40000);
  pVVar8->pArray = piVar9;
  local_60 = pVVar8;
  puVar10 = (undefined8 *)malloc(0x10);
  *puVar10 = 100;
  __ptr = malloc(400);
  puVar10[1] = __ptr;
  local_48 = puVar10;
  if (0 < pVVar14->nSize) {
    local_68 = p->vModel;
    lVar11 = 0;
    pGVar16 = local_70;
    local_54 = fVerbose;
    local_40 = pvStatus;
    do {
      iVar5 = pVVar14->pArray[lVar11];
      if (((long)iVar5 < 0) || (pGVar16->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar16->pObjs + iVar5;
      local_68->nSize = 0;
      iVar5 = (int)lVar11;
      if ((~*(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
          0x1fffffff1fffffff) == 0) {
        if (((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) == 0) {
          uVar2 = pVVar6->nSize;
          if (uVar2 == pVVar6->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar2 * 2;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar4);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = (int)sVar4;
            }
          }
          else {
            pcVar7 = pVVar6->pArray;
          }
          pVVar6->nSize = uVar2 + 1;
          pcVar7[(int)uVar2] = '\x01';
          pGVar16 = local_70;
        }
        else {
          Cec_ManSatAddToStore(local_60,local_68,iVar5);
          uVar2 = pVVar6->nSize;
          if (uVar2 == pVVar6->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar2 * 2;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar4);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = (int)sVar4;
            }
          }
          else {
            pcVar7 = pVVar6->pArray;
          }
          pVVar6->nSize = uVar2 + 1;
          pcVar7[(int)uVar2] = '\0';
          pGVar16 = local_70;
        }
      }
      else {
        iVar15 = clock_gettime(3,&local_80);
        if (iVar15 < 0) {
          lVar12 = 1;
        }
        else {
          lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
          lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_80.tv_sec * -1000000;
        }
        (p->Pars).fUseHighest = 1;
        (p->Pars).fUseLowest = 0;
        Gia_ManIncrementTravId(pGVar16);
        pGVar3 = pGVar16->pObjs;
        if ((pGVar1 < pGVar3) || (pGVar3 + pGVar16->nObjs <= pGVar1)) {
LAB_006f2d05:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Cbs2_ManCreateFanout_rec
                  (p,(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555 -
                     (*(uint *)pGVar1 & 0x1fffffff));
        pGVar3 = pGVar16->pObjs;
        if ((pGVar1 < pGVar3) || (pGVar3 + pGVar16->nObjs <= pGVar1)) goto LAB_006f2d05;
        iVar15 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555 -
                 (*(uint *)pGVar1 & 0x1fffffff);
        if (iVar15 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar15 = Cbs2_ManSolve(p,(*(uint *)pGVar1 >> 0x1d & 1) + iVar15 * 2);
        pGVar3 = pGVar16->pObjs;
        if ((pGVar1 < pGVar3) || (pGVar3 + pGVar16->nObjs <= pGVar1)) goto LAB_006f2d05;
        Cbs2_ManDeleteFanout_rec
                  (p,(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555 -
                     (*(uint *)pGVar1 & 0x1fffffff));
        uVar2 = pVVar6->nSize;
        if (uVar2 == pVVar6->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
            }
            pVVar6->pArray = pcVar7;
            pVVar6->nCap = 0x10;
          }
          else {
            local_38 = (ulong)uVar2 * 2;
            if (pVVar6->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(local_38);
            }
            else {
              pcVar7 = (char *)realloc(pVVar6->pArray,local_38);
            }
            pVVar6->pArray = pcVar7;
            pVVar6->nCap = (int)local_38;
          }
        }
        else {
          pcVar7 = pVVar6->pArray;
        }
        pGVar16 = local_70;
        pVVar6->nSize = uVar2 + 1;
        pcVar7[(int)uVar2] = (char)iVar15;
        if (iVar15 == 1) {
          p->nSatUnsat = p->nSatUnsat + 1;
          p->nConfUnsat = p->nConfUnsat + (p->Pars).nBTThis;
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSatUnsat = p->timeSatUnsat + lVar13 + lVar12;
          pGVar16 = local_70;
        }
        else if (iVar15 == -1) {
          p->nSatUndec = p->nSatUndec + 1;
          p->nConfUndec = p->nConfUndec + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(local_60,(Vec_Int_t *)0x0,iVar5);
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSatUndec = p->timeSatUndec + lVar13 + lVar12;
        }
        else {
          p->nSatSat = p->nSatSat + 1;
          p->nConfSat = p->nConfSat + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(local_60,local_68,iVar5);
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSatSat = p->timeSatSat + lVar13 + lVar12;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar14 = pGVar16->vCos;
    } while (lVar11 < pVVar14->nSize);
    __ptr = (void *)local_48[1];
    pvStatus = local_40;
    fVerbose = local_54;
  }
  pGVar16 = local_70;
  if (__ptr != (void *)0x0) {
    free(__ptr);
    pVVar14 = pGVar16->vCos;
  }
  free(local_48);
  p->nSatTotal = pVVar14->nSize - pGVar16->nRegs;
  iVar5 = clock_gettime(3,&local_80);
  if (iVar5 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  p->timeTotal = lVar11 + local_50;
  if (fVerbose != 0) {
    Cbs2_ManSatPrintStats(p);
  }
  iVar5 = 0x9fc256;
  printf("Prop1 = %d.  Prop2 = %d.  Prop3 = %d.  ClaConf = %d.   FailJ = %d.  FailC = %d.   ",
         (ulong)(uint)p->nPropCalls[0],(ulong)(uint)p->nPropCalls[1],(ulong)(uint)p->nPropCalls[2],
         (ulong)(uint)p->nClauseConf,(ulong)(uint)p->nFails[0],p->nFails[1]);
  local_68 = (Vec_Int_t *)(double)p->timeJFront;
  Abc_Print(iVar5,"%s =","JFront");
  Abc_Print(iVar5,"%9.2f sec\n",(double)local_68 / 1000000.0);
  Cbs2_ManStop(p);
  *pvStatus = pVVar6;
  return local_60;
}

Assistant:

Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Gia_ManCollectTest( Gia_Man_t * pAig );
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Cbs2_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot; 
    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
//    Gia_ManCollectTest( pAig );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    //Gia_ManLevelNum( pAig );
    //Gia_ManCleanMark0( pAig );
    //Gia_ManCleanMark1( pAig );
    //Gia_ManFillValue( pAig ); // maps nodes into trail ids
    //Gia_ManSetPhase( pAig ); // maps nodes into trail ids
    // create logic network
    p = Cbs2_ManAlloc( pAig );
    p->Pars.nBTLimit = nConfs;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Cbs2_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
        //printf( "\nOutput %d\n", i );

        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
//                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        clk = Abc_Clock();
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;

        Gia_ManIncrementTravId( pAig );
        Cbs2_ManCreateFanout_rec( p, Gia_ObjFaninId0p(pAig, pRoot) );
        //Cbs2_ManPrintFanouts( p );

        status = Cbs2_ManSolve( p, Gia_ObjFaninLit0p(pAig, pRoot) );
        //printf( "\n" );

        Cbs2_ManDeleteFanout_rec( p, Gia_ObjFaninId0p(pAig, pRoot) );
        //Cbs2_ManCheckFanouts( p );

/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Cbs2_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }
        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;
    }
    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Cbs2_ManSatPrintStats( p );
//    printf( "RecCalls = %8d.  RecClause = %8d.  RecNonChro = %8d.\n", p->nRecCall, p->nRecClause, p->nRecNonChro );
    printf( "Prop1 = %d.  Prop2 = %d.  Prop3 = %d.  ClaConf = %d.   FailJ = %d.  FailC = %d.   ", p->nPropCalls[0], p->nPropCalls[1], p->nPropCalls[2], p->nClauseConf, p->nFails[0], p->nFails[1] );
    Abc_PrintTime( 1, "JFront", p->timeJFront );

    Cbs2_ManStop( p );
    *pvStatus = vStatus;

//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}